

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O2

_Bool generate_sha2_512(uint8_t *output,EverCrypt_DRBG_state_s *st,uint32_t n,
                       uint8_t *additional_input,uint32_t additional_input_len)

{
  uint8_t *puVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  size_t __n;
  uint *puVar11;
  undefined1 *puVar12;
  undefined1 uVar13;
  _Bool _Var14;
  uint32_t uVar15;
  undefined7 extraout_var;
  undefined4 in_register_00000014;
  undefined8 uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint8_t *puVar20;
  uint8_t *puVar21;
  undefined4 in_register_00000084;
  uint8_t *puVar22;
  uint32_t input_len;
  uint8_t *puVar23;
  uint uVar24;
  uint8_t *puVar25;
  uint8_t auStack_c0 [8];
  uint32_t *local_b8;
  long local_b0;
  uint8_t *local_a8;
  uint8_t *local_a0;
  size_t local_98;
  uint8_t *local_90;
  uint8_t auStack_88 [4];
  uint local_84;
  ulong local_80;
  undefined8 local_78;
  uint *local_70;
  ulong local_68;
  undefined1 *local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  uint32_t input_len0_1;
  uint8_t *local_38;
  
  local_58 = (uint8_t *)CONCAT44(in_register_00000084,additional_input_len);
  local_78 = (uint8_t *)CONCAT44(in_register_00000014,n);
  uVar13 = 0;
  if ((additional_input_len <= Hacl_HMAC_DRBG_max_additional_input_length) &&
     (n <= Hacl_HMAC_DRBG_max_output_length)) {
    auStack_c0[0] = 0xc2;
    auStack_c0[1] = 0xc6;
    auStack_c0[2] = '\x15';
    auStack_c0[3] = '\0';
    auStack_c0[4] = '\0';
    auStack_c0[5] = '\0';
    auStack_c0[6] = '\0';
    auStack_c0[7] = '\0';
    _input_len0_1 = st;
    uVar15 = Hacl_HMAC_DRBG_min_length('\x03');
    uVar19 = (ulong)uVar15;
    lVar2 = -(uVar19 + 0xf & 0xfffffffffffffff0);
    puVar22 = (uint8_t *)((long)&local_b8 + lVar2);
    puVar20 = auStack_c0 + lVar2;
    local_60 = (undefined1 *)&local_b8;
    puVar20[0] = 0xe9;
    puVar20[1] = 0xc6;
    puVar20[2] = '\x15';
    puVar20[3] = '\0';
    puVar20[4] = '\0';
    puVar20[5] = '\0';
    puVar20[6] = '\0';
    puVar20[7] = '\0';
    memset(puVar22,0,uVar19);
    puVar21 = auStack_c0 + lVar2;
    puVar21[0] = 0xf3;
    puVar21[1] = 0xc6;
    puVar21[2] = '\x15';
    puVar21[3] = '\0';
    puVar21[4] = '\0';
    puVar21[5] = '\0';
    puVar21[6] = '\0';
    puVar21[7] = '\0';
    _Var14 = Lib_RandomBuffer_System_randombytes(puVar22,uVar15);
    puVar1 = local_58;
    uVar18 = CONCAT71(extraout_var,_Var14);
    if (_Var14) {
      local_84 = (uint)uVar18;
      local_90 = (_input_len0_1->field_1).case_SHA1_s.k;
      local_48 = (_input_len0_1->field_1).case_SHA1_s.v;
      local_b8 = (_input_len0_1->field_1).case_SHA1_s.reseed_counter;
      iVar3 = (int)local_58;
      uVar18 = (ulong)(uVar15 + iVar3);
      local_80 = CONCAT71(local_80._1_7_,_input_len0_1->tag);
      puVar25 = puVar22 + -(uVar18 + 0xf & 0xfffffffffffffff0);
      local_50 = additional_input;
      local_38 = (uint8_t *)uVar18;
      puVar25[-8] = 'Q';
      puVar25[-7] = 199;
      puVar25[-6] = '\x15';
      puVar25[-5] = '\0';
      puVar25[-4] = '\0';
      puVar25[-3] = '\0';
      puVar25[-2] = '\0';
      puVar25[-1] = '\0';
      memset(puVar25,0,uVar18);
      puVar25[-8] = '_';
      puVar25[-7] = 199;
      puVar25[-6] = '\x15';
      puVar25[-5] = '\0';
      puVar25[-4] = '\0';
      puVar25[-3] = '\0';
      puVar25[-2] = '\0';
      puVar25[-1] = '\0';
      memcpy(puVar25,puVar22,uVar19);
      puVar22 = local_50;
      local_70 = (uint *)puVar25;
      local_68 = (ulong)puVar1 & 0xffffffff;
      puVar25[-8] = 'v';
      puVar25[-7] = 199;
      puVar25[-6] = '\x15';
      puVar25[-5] = '\0';
      puVar25[-4] = '\0';
      puVar25[-3] = '\0';
      puVar25[-2] = '\0';
      puVar25[-1] = '\0';
      memcpy(puVar25 + uVar19,puVar22,(ulong)puVar1 & 0xffffffff);
      if ((char)local_80 != '\x03') {
        uVar16 = 0x63f;
LAB_0015cdf5:
        puVar25[-8] = 0xfc;
        puVar25[-7] = 0xcd;
        puVar25[-6] = '\x15';
        puVar25[-5] = '\0';
        puVar25[-4] = '\0';
        puVar25[-3] = '\0';
        puVar25[-2] = '\0';
        puVar25[-1] = '\0';
        printf("KaRaMeL abort at %s:%d\n%s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
               ,uVar16,"unreachable (pattern matches are exhaustive in F*)");
        *(code **)(puVar25 + -8) = EverCrypt_DRBG_uninstantiate;
        exit(0xff);
      }
      uVar24 = iVar3 + uVar15 + 0x41;
      uVar19 = (ulong)uVar24;
      uVar18 = uVar19 + 0xf & 0xfffffffffffffff0;
      puVar22 = puVar25 + -uVar18;
      puVar22[-8] = 0xa9;
      puVar22[-7] = 199;
      puVar22[-6] = '\x15';
      puVar22[-5] = '\0';
      puVar22[-4] = '\0';
      puVar22[-3] = '\0';
      puVar22[-2] = '\0';
      puVar22[-1] = '\0';
      memset(puVar22,0,uVar19);
      local_80 = uVar18;
      uVar16 = *(undefined8 *)local_48;
      uVar4 = *(undefined8 *)(local_48 + 8);
      uVar5 = *(undefined8 *)(local_48 + 0x10);
      uVar6 = *(undefined8 *)(local_48 + 0x18);
      uVar7 = *(undefined8 *)(local_48 + 0x20);
      uVar8 = *(undefined8 *)(local_48 + 0x28);
      uVar9 = *(undefined8 *)(local_48 + 0x38);
      *(undefined8 *)(puVar25 + -uVar18 + 0x30) = *(undefined8 *)(local_48 + 0x30);
      *(undefined8 *)(puVar25 + -uVar18 + 0x30 + 8) = uVar9;
      *(undefined8 *)puVar22 = uVar16;
      *(undefined8 *)(puVar22 + 8) = uVar4;
      *(undefined8 *)(puVar22 + 0x10) = uVar5;
      *(undefined8 *)(puVar22 + 0x18) = uVar6;
      *(undefined8 *)(puVar22 + 0x20) = uVar7;
      *(undefined8 *)(puVar22 + 0x28) = uVar8;
      puVar1 = local_38;
      puVar11 = local_70;
      if (local_38 == (uint8_t *)0x0) {
        puVar22[0x40] = '\0';
        puVar22[-8] = '@';
        puVar1 = local_90;
        puVar22[-7] = '\0';
        puVar22[-6] = '\0';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        uVar15 = (uint32_t)*(undefined8 *)(puVar22 + -8);
        puVar22[-8] = 'N';
        puVar22[-7] = 0xc9;
        puVar22[-6] = '\x15';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar22,puVar1,uVar15,puVar22,uVar24);
        puVar25 = local_48;
        puVar22[-8] = 'c';
        puVar22[-7] = 0xc9;
        puVar22[-6] = '\x15';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar25,puVar22,uVar15,puVar25,uVar15);
        uVar16 = *(undefined8 *)puVar22;
        uVar4 = *(undefined8 *)(puVar22 + 8);
        uVar5 = *(undefined8 *)(puVar22 + 0x10);
        uVar6 = *(undefined8 *)(puVar22 + 0x18);
        uVar7 = *(undefined8 *)(puVar22 + 0x20);
        uVar8 = *(undefined8 *)(puVar22 + 0x28);
        uVar9 = *(undefined8 *)(puVar22 + 0x38);
        *(undefined8 *)(puVar1 + 0x30) = *(undefined8 *)(puVar22 + 0x30);
        *(undefined8 *)(puVar1 + 0x38) = uVar9;
        *(undefined8 *)(puVar1 + 0x20) = uVar7;
        *(undefined8 *)(puVar1 + 0x28) = uVar8;
        *(undefined8 *)(puVar1 + 0x10) = uVar5;
        *(undefined8 *)(puVar1 + 0x18) = uVar6;
        *(undefined8 *)puVar1 = uVar16;
        *(undefined8 *)(puVar1 + 8) = uVar4;
      }
      else {
        local_b0 = -uVar18;
        puVar22[-8] = 0xfb;
        puVar22[-7] = 199;
        puVar22[-6] = '\x15';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        memcpy(puVar22 + 0x41,puVar11,(size_t)puVar1);
        puVar22[0x40] = '\0';
        puVar22[-8] = '@';
        puVar1 = local_90;
        puVar22[-7] = '\0';
        puVar22[-6] = '\0';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        uVar15 = (uint32_t)*(undefined8 *)(puVar22 + -8);
        puVar22[-8] = '\x1f';
        puVar22[-7] = 200;
        puVar22[-6] = '\x15';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar22,puVar1,uVar15,puVar22,uVar24);
        puVar25 = local_48;
        local_98 = uVar19;
        puVar22[-8] = '>';
        puVar22[-7] = 200;
        puVar22[-6] = '\x15';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar25,puVar22,uVar15,puVar25,uVar15);
        __n = local_98;
        local_a8 = puVar22;
        uVar16 = *(undefined8 *)puVar22;
        uVar4 = *(undefined8 *)(puVar22 + 8);
        uVar5 = *(undefined8 *)(puVar22 + 0x10);
        uVar6 = *(undefined8 *)(puVar22 + 0x18);
        uVar7 = *(undefined8 *)(puVar22 + 0x20);
        uVar8 = *(undefined8 *)(puVar22 + 0x28);
        uVar9 = *(undefined8 *)(puVar22 + 0x38);
        *(undefined8 *)(puVar1 + 0x30) = *(undefined8 *)(puVar22 + 0x30);
        *(undefined8 *)(puVar1 + 0x38) = uVar9;
        *(undefined8 *)(puVar1 + 0x20) = uVar7;
        *(undefined8 *)(puVar1 + 0x28) = uVar8;
        *(undefined8 *)(puVar1 + 0x10) = uVar5;
        *(undefined8 *)(puVar1 + 0x18) = uVar6;
        *(undefined8 *)puVar1 = uVar16;
        *(undefined8 *)(puVar1 + 8) = uVar4;
        puVar23 = puVar22 + -local_80;
        local_a0 = puVar22;
        puVar23[-8] = 0x8d;
        puVar23[-7] = 200;
        puVar23[-6] = '\x15';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memset(puVar23,0,__n);
        uVar16 = *(undefined8 *)(puVar25 + 8);
        uVar4 = *(undefined8 *)(puVar25 + 0x10);
        uVar5 = *(undefined8 *)(puVar25 + 0x18);
        uVar6 = *(undefined8 *)(puVar25 + 0x20);
        uVar7 = *(undefined8 *)(puVar25 + 0x28);
        uVar8 = *(undefined8 *)(puVar25 + 0x30);
        uVar9 = *(undefined8 *)(puVar25 + 0x38);
        *(undefined8 *)puVar23 = *(undefined8 *)puVar25;
        *(undefined8 *)(puVar23 + 8) = uVar16;
        *(undefined8 *)(puVar23 + 0x10) = uVar4;
        *(undefined8 *)(puVar23 + 0x18) = uVar5;
        *(undefined8 *)(puVar23 + 0x20) = uVar6;
        *(undefined8 *)(puVar23 + 0x28) = uVar7;
        *(undefined8 *)(puVar23 + 0x30) = uVar8;
        *(undefined8 *)(puVar23 + 0x38) = uVar9;
        puVar22 = local_38;
        puVar11 = local_70;
        puVar23[-8] = 0xc4;
        puVar23[-7] = 200;
        puVar23[-6] = '\x15';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memcpy(puVar23 + 0x41,puVar11,(size_t)puVar22);
        puVar23[0x40] = '\x01';
        puVar23[-8] = '@';
        puVar23[-7] = '\0';
        puVar23[-6] = '\0';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        uVar16 = *(undefined8 *)(puVar23 + -8);
        puVar23[-8] = 0xdd;
        puVar23[-7] = 200;
        puVar23[-6] = '\x15';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar23,puVar1,(uint32_t)uVar16,puVar23,(uint32_t)__n);
        puVar23[-8] = '@';
        puVar23[-7] = '\0';
        puVar23[-6] = '\0';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        uVar16 = *(undefined8 *)(puVar23 + -8);
        puVar23[-8] = 0xf1;
        puVar23[-7] = 200;
        puVar23[-6] = '\x15';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar25,puVar23,(uint32_t)uVar16,puVar25,(uint32_t)uVar16);
        uVar16 = *(undefined8 *)(puVar23 + 0x10);
        uVar4 = *(undefined8 *)(puVar23 + 0x18);
        uVar5 = *(undefined8 *)(puVar23 + 0x20);
        uVar6 = *(undefined8 *)(puVar23 + 0x28);
        uVar7 = *(undefined8 *)(puVar23 + 0x38);
        *(undefined8 *)(puVar1 + 0x30) = *(undefined8 *)(puVar23 + 0x30);
        *(undefined8 *)(puVar1 + 0x38) = uVar7;
        *(undefined8 *)(puVar1 + 0x20) = uVar5;
        *(undefined8 *)(puVar1 + 0x28) = uVar6;
        *(undefined8 *)(puVar1 + 0x10) = uVar16;
        *(undefined8 *)(puVar1 + 0x18) = uVar4;
        uVar16 = *(undefined8 *)(local_a0 + local_b0 + 8);
        *(undefined8 *)puVar1 = *(undefined8 *)(local_a0 + local_b0);
        *(undefined8 *)(puVar1 + 8) = uVar16;
      }
      *local_b8 = 1;
      if (_input_len0_1->tag != '\x03') {
        uVar16 = 0x678;
        puVar25 = local_60;
        goto LAB_0015cdf5;
      }
      local_70 = (_input_len0_1->field_1).case_SHA1_s.reseed_counter;
      if (Hacl_HMAC_DRBG_reseed_interval < *local_70) {
        return false;
      }
      uVar24 = (int)local_58 + 0x41;
      local_38 = (_input_len0_1->field_1).case_SHA1_s.k;
      puVar1 = (_input_len0_1->field_1).case_SHA1_s.v;
      uVar18 = (ulong)uVar24;
      _input_len0_1 = (EverCrypt_DRBG_state_s *)uVar18;
      if ((int)local_58 != 0) {
        uVar19 = uVar18 + 0xf & 0xfffffffffffffff0;
        puVar22 = local_60 + -uVar19;
        puVar22[-8] = '\n';
        puVar22[-7] = 0xca;
        puVar22[-6] = '\x15';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        memset(puVar22,0,uVar18);
        uVar16 = *(undefined8 *)(puVar1 + 8);
        uVar4 = *(undefined8 *)(puVar1 + 0x10);
        uVar5 = *(undefined8 *)(puVar1 + 0x18);
        uVar6 = *(undefined8 *)(puVar1 + 0x20);
        uVar7 = *(undefined8 *)(puVar1 + 0x28);
        uVar8 = *(undefined8 *)(puVar1 + 0x30);
        uVar9 = *(undefined8 *)(puVar1 + 0x38);
        *(undefined8 *)puVar22 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar22 + 8) = uVar16;
        *(undefined8 *)(puVar22 + 0x10) = uVar4;
        *(undefined8 *)(puVar22 + 0x18) = uVar5;
        *(undefined8 *)(puVar22 + 0x20) = uVar6;
        *(undefined8 *)(puVar22 + 0x28) = uVar7;
        *(undefined8 *)(puVar22 + 0x30) = uVar8;
        *(undefined8 *)(puVar22 + 0x38) = uVar9;
        puVar22[-8] = 'B';
        puVar22[-7] = 0xca;
        puVar22[-6] = '\x15';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        memcpy(puVar22 + 0x41,local_50,local_68);
        puVar22[0x40] = '\0';
        puVar22[-8] = '@';
        puVar22[-7] = '\0';
        puVar22[-6] = '\0';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        uVar16 = *(undefined8 *)(puVar22 + -8);
        puVar22[-8] = '\\';
        puVar22[-7] = 0xca;
        puVar22[-6] = '\x15';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar22,local_38,(uint32_t)uVar16,puVar22,uVar24);
        puVar22[-8] = '@';
        puVar22[-7] = '\0';
        puVar22[-6] = '\0';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        uVar16 = *(undefined8 *)(puVar22 + -8);
        puVar22[-8] = 'p';
        puVar22[-7] = 0xca;
        puVar22[-6] = '\x15';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar1,puVar22,(uint32_t)uVar16,puVar1,(uint32_t)uVar16);
        uVar16 = *(undefined8 *)puVar22;
        uVar4 = *(undefined8 *)(puVar22 + 8);
        uVar5 = *(undefined8 *)(puVar22 + 0x10);
        uVar6 = *(undefined8 *)(puVar22 + 0x18);
        uVar7 = *(undefined8 *)(puVar22 + 0x20);
        uVar8 = *(undefined8 *)(puVar22 + 0x28);
        uVar9 = *(undefined8 *)(puVar22 + 0x38);
        *(undefined8 *)(local_38 + 0x30) = *(undefined8 *)(puVar22 + 0x30);
        *(undefined8 *)(local_38 + 0x38) = uVar9;
        *(undefined8 *)(local_38 + 0x20) = uVar7;
        *(undefined8 *)(local_38 + 0x28) = uVar8;
        *(undefined8 *)(local_38 + 0x10) = uVar5;
        *(undefined8 *)(local_38 + 0x18) = uVar6;
        *(undefined8 *)local_38 = uVar16;
        *(undefined8 *)(local_38 + 8) = uVar4;
        puVar22 = puVar22 + -uVar19;
        puVar22[-8] = 0xb9;
        puVar22[-7] = 0xca;
        puVar22[-6] = '\x15';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        memset(puVar22,0,(size_t)_input_len0_1);
        uVar16 = *(undefined8 *)(puVar1 + 8);
        uVar4 = *(undefined8 *)(puVar1 + 0x10);
        uVar5 = *(undefined8 *)(puVar1 + 0x18);
        uVar6 = *(undefined8 *)(puVar1 + 0x20);
        uVar7 = *(undefined8 *)(puVar1 + 0x28);
        uVar8 = *(undefined8 *)(puVar1 + 0x30);
        uVar9 = *(undefined8 *)(puVar1 + 0x38);
        *(undefined8 *)puVar22 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar22 + 8) = uVar16;
        *(undefined8 *)(puVar22 + 0x10) = uVar4;
        *(undefined8 *)(puVar22 + 0x18) = uVar5;
        *(undefined8 *)(puVar22 + 0x20) = uVar6;
        *(undefined8 *)(puVar22 + 0x28) = uVar7;
        *(undefined8 *)(puVar22 + 0x30) = uVar8;
        *(undefined8 *)(puVar22 + 0x38) = uVar9;
        puVar22[-8] = 0xf1;
        puVar22[-7] = 0xca;
        puVar22[-6] = '\x15';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        memcpy(puVar22 + 0x41,local_50,local_68);
        puVar22[0x40] = '\x01';
        puVar22[-8] = '@';
        puVar22[-7] = '\0';
        puVar22[-6] = '\0';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        uVar15 = (uint32_t)*(undefined8 *)(puVar22 + -8);
        puVar22[-8] = '\r';
        puVar22[-7] = 0xcb;
        puVar22[-6] = '\x15';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar22,local_38,uVar15,puVar22,uVar24);
        puVar22[-8] = ' ';
        puVar22[-7] = 0xcb;
        puVar22[-6] = '\x15';
        puVar22[-5] = '\0';
        puVar22[-4] = '\0';
        puVar22[-3] = '\0';
        puVar22[-2] = '\0';
        puVar22[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar1,puVar22,uVar15,puVar1,uVar15);
        uVar16 = *(undefined8 *)puVar22;
        uVar4 = *(undefined8 *)(puVar22 + 8);
        uVar5 = *(undefined8 *)(puVar22 + 0x10);
        uVar6 = *(undefined8 *)(puVar22 + 0x18);
        uVar7 = *(undefined8 *)(puVar22 + 0x20);
        uVar8 = *(undefined8 *)(puVar22 + 0x28);
        uVar9 = *(undefined8 *)(puVar22 + 0x38);
        *(undefined8 *)(local_38 + 0x30) = *(undefined8 *)(puVar22 + 0x30);
        *(undefined8 *)(local_38 + 0x38) = uVar9;
        *(undefined8 *)(local_38 + 0x20) = uVar7;
        *(undefined8 *)(local_38 + 0x28) = uVar8;
        *(undefined8 *)(local_38 + 0x10) = uVar5;
        *(undefined8 *)(local_38 + 0x18) = uVar6;
        *(undefined8 *)local_38 = uVar16;
        *(undefined8 *)(local_38 + 8) = uVar4;
      }
      puVar12 = local_60;
      local_48 = (uint8_t *)CONCAT44(local_48._4_4_,uVar24);
      uVar24 = (uint)local_78 & 0xffffffc0;
      *(undefined8 *)(local_60 + -8) = 0x40;
      uVar16 = *(undefined8 *)(local_60 + -8);
      for (uVar18 = 0; uVar24 != uVar18; uVar18 = uVar18 + 0x40) {
        *(undefined8 *)(puVar12 + -8) = 0x15cb75;
        EverCrypt_HMAC_compute_sha2_512(puVar1,local_38,(uint32_t)uVar16,puVar1,(uint32_t)uVar16);
        uVar4 = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 8);
        uVar6 = *(undefined8 *)(puVar1 + 0x10);
        uVar7 = *(undefined8 *)(puVar1 + 0x18);
        uVar8 = *(undefined8 *)(puVar1 + 0x20);
        uVar9 = *(undefined8 *)(puVar1 + 0x28);
        uVar10 = *(undefined8 *)(puVar1 + 0x38);
        *(undefined8 *)(output + uVar18 + 0x30) = *(undefined8 *)(puVar1 + 0x30);
        *(undefined8 *)(output + uVar18 + 0x30 + 8) = uVar10;
        *(undefined8 *)(output + uVar18 + 0x20) = uVar8;
        *(undefined8 *)(output + uVar18 + 0x20 + 8) = uVar9;
        *(undefined8 *)(output + uVar18 + 0x10) = uVar6;
        *(undefined8 *)(output + uVar18 + 0x10 + 8) = uVar7;
        *(undefined8 *)(output + uVar18) = uVar4;
        *(undefined8 *)(output + uVar18 + 8) = uVar5;
      }
      uVar17 = (uint)local_78;
      if (uVar24 != uVar17) {
        *(undefined8 *)(puVar12 + -8) = 0x40;
        uVar16 = *(undefined8 *)(puVar12 + -8);
        *(undefined8 *)(puVar12 + -8) = 0x15cbca;
        EverCrypt_HMAC_compute_sha2_512(puVar1,local_38,(uint32_t)uVar16,puVar1,(uint32_t)uVar16);
        *(undefined8 *)(puVar12 + -8) = 0x15cbdb;
        memcpy(output + uVar24,puVar1,(ulong)(uVar17 & 0x3f));
      }
      uVar18 = (long)_input_len0_1 + 0xfU & 0xfffffffffffffff0;
      puVar25 = puVar12 + -uVar18;
      puVar25[-8] = '\x01';
      puVar25[-7] = 0xcc;
      puVar25[-6] = '\x15';
      puVar25[-5] = '\0';
      puVar25[-4] = '\0';
      puVar25[-3] = '\0';
      puVar25[-2] = '\0';
      puVar25[-1] = '\0';
      local_60 = puVar12;
      memset(puVar25,0,(size_t)_input_len0_1);
      puVar22 = local_38;
      uVar16 = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 8);
      uVar5 = *(undefined8 *)(puVar1 + 0x10);
      uVar6 = *(undefined8 *)(puVar1 + 0x18);
      uVar7 = *(undefined8 *)(puVar1 + 0x20);
      uVar8 = *(undefined8 *)(puVar1 + 0x28);
      uVar9 = *(undefined8 *)(puVar1 + 0x38);
      *(undefined8 *)(puVar12 + -uVar18 + 0x30) = *(undefined8 *)(puVar1 + 0x30);
      *(undefined8 *)((long)(puVar12 + -uVar18 + 0x30) + 8) = uVar9;
      *(undefined8 *)puVar25 = uVar16;
      *(undefined8 *)(puVar25 + 8) = uVar4;
      *(undefined8 *)(puVar25 + 0x10) = uVar5;
      *(undefined8 *)(puVar25 + 0x18) = uVar6;
      *(undefined8 *)(puVar25 + 0x20) = uVar7;
      *(undefined8 *)(puVar25 + 0x28) = uVar8;
      if ((int)local_58 == 0) {
        puVar25[0x40] = '\0';
        puVar25[-8] = '@';
        puVar25[-7] = '\0';
        puVar25[-6] = '\0';
        puVar25[-5] = '\0';
        puVar25[-4] = '\0';
        puVar25[-3] = '\0';
        puVar25[-2] = '\0';
        puVar25[-1] = '\0';
        uVar15 = (uint32_t)*(undefined8 *)(puVar25 + -8);
        puVar25[-8] = 'm';
        puVar25[-7] = 0xcd;
        puVar25[-6] = '\x15';
        puVar25[-5] = '\0';
        puVar25[-4] = '\0';
        puVar25[-3] = '\0';
        puVar25[-2] = '\0';
        puVar25[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar25,local_38,uVar15,puVar25,(uint32_t)local_48);
        puVar25[-8] = 0x81;
        puVar25[-7] = 0xcd;
        puVar25[-6] = '\x15';
        puVar25[-5] = '\0';
        puVar25[-4] = '\0';
        puVar25[-3] = '\0';
        puVar25[-2] = '\0';
        puVar25[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar1,puVar25,uVar15,puVar1,uVar15);
        uVar16 = *(undefined8 *)puVar25;
        uVar4 = *(undefined8 *)(puVar25 + 8);
        uVar5 = *(undefined8 *)(puVar25 + 0x10);
        uVar6 = *(undefined8 *)(puVar25 + 0x18);
        uVar7 = *(undefined8 *)(puVar25 + 0x20);
        uVar8 = *(undefined8 *)(puVar25 + 0x28);
        uVar9 = *(undefined8 *)(puVar25 + 0x38);
        *(undefined8 *)(puVar22 + 0x30) = *(undefined8 *)(puVar25 + 0x30);
        *(undefined8 *)(puVar22 + 0x38) = uVar9;
        *(undefined8 *)(puVar22 + 0x20) = uVar7;
        *(undefined8 *)(puVar22 + 0x28) = uVar8;
        *(undefined8 *)(puVar22 + 0x10) = uVar5;
        *(undefined8 *)(puVar22 + 0x18) = uVar6;
        *(undefined8 *)puVar22 = uVar16;
        *(undefined8 *)(puVar22 + 8) = uVar4;
      }
      else {
        puVar25[-8] = 'G';
        puVar25[-7] = 0xcc;
        puVar25[-6] = '\x15';
        puVar25[-5] = '\0';
        puVar25[-4] = '\0';
        puVar25[-3] = '\0';
        puVar25[-2] = '\0';
        puVar25[-1] = '\0';
        memcpy(puVar25 + 0x41,local_50,local_68);
        puVar22 = local_38;
        puVar25[0x40] = '\0';
        puVar25[-8] = '@';
        puVar25[-7] = '\0';
        puVar25[-6] = '\0';
        puVar25[-5] = '\0';
        puVar25[-4] = '\0';
        puVar25[-3] = '\0';
        puVar25[-2] = '\0';
        puVar25[-1] = '\0';
        uVar16 = *(undefined8 *)(puVar25 + -8);
        puVar25[-8] = 'd';
        puVar25[-7] = 0xcc;
        puVar25[-6] = '\x15';
        puVar25[-5] = '\0';
        puVar25[-4] = '\0';
        puVar25[-3] = '\0';
        puVar25[-2] = '\0';
        puVar25[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512
                  (puVar25,local_38,(uint32_t)uVar16,puVar25,(uint32_t)local_48);
        puVar25[-8] = '@';
        puVar25[-7] = '\0';
        puVar25[-6] = '\0';
        puVar25[-5] = '\0';
        puVar25[-4] = '\0';
        puVar25[-3] = '\0';
        puVar25[-2] = '\0';
        puVar25[-1] = '\0';
        uVar16 = *(undefined8 *)(puVar25 + -8);
        puVar25[-8] = 'x';
        puVar25[-7] = 0xcc;
        puVar25[-6] = '\x15';
        puVar25[-5] = '\0';
        puVar25[-4] = '\0';
        puVar25[-3] = '\0';
        puVar25[-2] = '\0';
        puVar25[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar1,puVar25,(uint32_t)uVar16,puVar1,(uint32_t)uVar16);
        uVar16 = *(undefined8 *)puVar25;
        uVar4 = *(undefined8 *)(puVar25 + 8);
        uVar5 = *(undefined8 *)(puVar25 + 0x10);
        uVar6 = *(undefined8 *)(puVar25 + 0x18);
        uVar7 = *(undefined8 *)(puVar25 + 0x20);
        uVar8 = *(undefined8 *)(puVar25 + 0x28);
        uVar9 = *(undefined8 *)(puVar25 + 0x38);
        *(undefined8 *)(puVar22 + 0x30) = *(undefined8 *)(puVar25 + 0x30);
        *(undefined8 *)(puVar22 + 0x38) = uVar9;
        *(undefined8 *)(puVar22 + 0x20) = uVar7;
        *(undefined8 *)(puVar22 + 0x28) = uVar8;
        *(undefined8 *)(puVar22 + 0x10) = uVar5;
        *(undefined8 *)(puVar22 + 0x18) = uVar6;
        *(undefined8 *)puVar22 = uVar16;
        *(undefined8 *)(puVar22 + 8) = uVar4;
        puVar23 = puVar25 + -uVar18;
        puVar23[-8] = 0xb9;
        puVar23[-7] = 0xcc;
        puVar23[-6] = '\x15';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        local_78 = puVar25;
        local_58 = puVar25;
        memset(puVar23,0,(size_t)_input_len0_1);
        uVar16 = *(undefined8 *)(puVar1 + 8);
        uVar4 = *(undefined8 *)(puVar1 + 0x10);
        uVar5 = *(undefined8 *)(puVar1 + 0x18);
        uVar6 = *(undefined8 *)(puVar1 + 0x20);
        uVar7 = *(undefined8 *)(puVar1 + 0x28);
        uVar8 = *(undefined8 *)(puVar1 + 0x30);
        uVar9 = *(undefined8 *)(puVar1 + 0x38);
        *(undefined8 *)puVar23 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar23 + 8) = uVar16;
        *(undefined8 *)(puVar23 + 0x10) = uVar4;
        *(undefined8 *)(puVar23 + 0x18) = uVar5;
        *(undefined8 *)(puVar23 + 0x20) = uVar6;
        *(undefined8 *)(puVar23 + 0x28) = uVar7;
        *(undefined8 *)(puVar23 + 0x30) = uVar8;
        *(undefined8 *)(puVar23 + 0x38) = uVar9;
        puVar23[-8] = 0xed;
        puVar23[-7] = 0xcc;
        puVar23[-6] = '\x15';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memcpy(puVar23 + 0x41,local_50,local_68);
        puVar23[0x40] = '\x01';
        puVar23[-8] = '@';
        puVar23[-7] = '\0';
        puVar23[-6] = '\0';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        uVar15 = (uint32_t)*(undefined8 *)(puVar23 + -8);
        puVar23[-8] = '\n';
        puVar23[-7] = 0xcd;
        puVar23[-6] = '\x15';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar23,puVar22,uVar15,puVar23,(uint32_t)local_48);
        puVar23[-8] = '\x1e';
        puVar23[-7] = 0xcd;
        puVar23[-6] = '\x15';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar1,puVar23,uVar15,puVar1,uVar15);
        uVar16 = *(undefined8 *)(puVar23 + 0x10);
        uVar4 = *(undefined8 *)(puVar23 + 0x18);
        uVar5 = *(undefined8 *)(puVar23 + 0x20);
        uVar6 = *(undefined8 *)(puVar23 + 0x28);
        uVar7 = *(undefined8 *)(puVar23 + 0x38);
        *(undefined8 *)(puVar22 + 0x30) = *(undefined8 *)(puVar23 + 0x30);
        *(undefined8 *)(puVar22 + 0x38) = uVar7;
        *(undefined8 *)(puVar22 + 0x20) = uVar5;
        *(undefined8 *)(puVar22 + 0x28) = uVar6;
        *(undefined8 *)(puVar22 + 0x10) = uVar16;
        *(undefined8 *)(puVar22 + 0x18) = uVar4;
        uVar16 = *(undefined8 *)(local_78 + -uVar18 + 8);
        *(undefined8 *)puVar22 = *(undefined8 *)(local_78 + -uVar18);
        *(undefined8 *)(puVar22 + 8) = uVar16;
      }
      *local_70 = *local_70 + 1;
      uVar18 = (ulong)local_84;
    }
    uVar13 = (undefined1)uVar18;
  }
  return (_Bool)uVar13;
}

Assistant:

static bool
generate_sha2_512(
  uint8_t *output,
  EverCrypt_DRBG_state_s *st,
  uint32_t n,
  uint8_t *additional_input,
  uint32_t additional_input_len
)
{
  if
  (
    additional_input_len
    > Hacl_HMAC_DRBG_max_additional_input_length
    || n > Hacl_HMAC_DRBG_max_output_length
  )
  {
    return false;
  }
  bool ok0;
  if (additional_input_len > Hacl_HMAC_DRBG_max_additional_input_length)
  {
    ok0 = false;
  }
  else
  {
    uint32_t entropy_input_len = Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_SHA2_512);
    KRML_CHECK_SIZE(sizeof (uint8_t), entropy_input_len);
    uint8_t entropy_input[entropy_input_len];
    memset(entropy_input, 0U, entropy_input_len * sizeof (uint8_t));
    bool ok = Lib_RandomBuffer_System_randombytes(entropy_input, entropy_input_len);
    bool result;
    if (!ok)
    {
      result = false;
    }
    else
    {
      EverCrypt_DRBG_state_s st_s = *st;
      KRML_CHECK_SIZE(sizeof (uint8_t), entropy_input_len + additional_input_len);
      uint8_t seed_material[entropy_input_len + additional_input_len];
      memset(seed_material, 0U, (entropy_input_len + additional_input_len) * sizeof (uint8_t));
      memcpy(seed_material, entropy_input, entropy_input_len * sizeof (uint8_t));
      memcpy(seed_material + entropy_input_len,
        additional_input,
        additional_input_len * sizeof (uint8_t));
      Hacl_HMAC_DRBG_state scrut;
      if (st_s.tag == SHA2_512_s)
      {
        scrut = st_s.case_SHA2_512_s;
      }
      else
      {
        scrut =
          KRML_EABORT(Hacl_HMAC_DRBG_state,
            "unreachable (pattern matches are exhaustive in F*)");
      }
      uint8_t *k = scrut.k;
      uint8_t *v = scrut.v;
      uint32_t *ctr = scrut.reseed_counter;
      uint32_t input_len = 65U + entropy_input_len + additional_input_len;
      KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
      uint8_t input0[input_len];
      memset(input0, 0U, input_len * sizeof (uint8_t));
      uint8_t *k_ = input0;
      memcpy(k_, v, 64U * sizeof (uint8_t));
      if (entropy_input_len + additional_input_len != 0U)
      {
        memcpy(input0 + 65U,
          seed_material,
          (entropy_input_len + additional_input_len) * sizeof (uint8_t));
      }
      input0[64U] = 0U;
      EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
      EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
      memcpy(k, k_, 64U * sizeof (uint8_t));
      if (entropy_input_len + additional_input_len != 0U)
      {
        uint32_t input_len0 = 65U + entropy_input_len + additional_input_len;
        KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
        uint8_t input[input_len0];
        memset(input, 0U, input_len0 * sizeof (uint8_t));
        uint8_t *k_0 = input;
        memcpy(k_0, v, 64U * sizeof (uint8_t));
        if (entropy_input_len + additional_input_len != 0U)
        {
          memcpy(input + 65U,
            seed_material,
            (entropy_input_len + additional_input_len) * sizeof (uint8_t));
        }
        input[64U] = 1U;
        EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
        EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
        memcpy(k, k_0, 64U * sizeof (uint8_t));
      }
      ctr[0U] = 1U;
      result = true;
    }
    ok0 = result;
  }
  if (!ok0)
  {
    return false;
  }
  EverCrypt_DRBG_state_s st_s = *st;
  Hacl_HMAC_DRBG_state ite;
  if (st_s.tag == SHA2_512_s)
  {
    ite = st_s.case_SHA2_512_s;
  }
  else
  {
    ite = KRML_EABORT(Hacl_HMAC_DRBG_state, "unreachable (pattern matches are exhaustive in F*)");
  }
  if (ite.reseed_counter[0U] > Hacl_HMAC_DRBG_reseed_interval)
  {
    return false;
  }
  Hacl_HMAC_DRBG_state scrut;
  if (st_s.tag == SHA2_512_s)
  {
    scrut = st_s.case_SHA2_512_s;
  }
  else
  {
    scrut = KRML_EABORT(Hacl_HMAC_DRBG_state, "unreachable (pattern matches are exhaustive in F*)");
  }
  uint8_t *k = scrut.k;
  uint8_t *v = scrut.v;
  uint32_t *ctr = scrut.reseed_counter;
  if (additional_input_len > 0U)
  {
    uint32_t input_len = 65U + additional_input_len;
    KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
    uint8_t input0[input_len];
    memset(input0, 0U, input_len * sizeof (uint8_t));
    uint8_t *k_ = input0;
    memcpy(k_, v, 64U * sizeof (uint8_t));
    if (additional_input_len != 0U)
    {
      memcpy(input0 + 65U, additional_input, additional_input_len * sizeof (uint8_t));
    }
    input0[64U] = 0U;
    EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
    EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
    memcpy(k, k_, 64U * sizeof (uint8_t));
    if (additional_input_len != 0U)
    {
      uint32_t input_len0 = 65U + additional_input_len;
      KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
      uint8_t input[input_len0];
      memset(input, 0U, input_len0 * sizeof (uint8_t));
      uint8_t *k_0 = input;
      memcpy(k_0, v, 64U * sizeof (uint8_t));
      if (additional_input_len != 0U)
      {
        memcpy(input + 65U, additional_input, additional_input_len * sizeof (uint8_t));
      }
      input[64U] = 1U;
      EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
      EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
      memcpy(k, k_0, 64U * sizeof (uint8_t));
    }
  }
  uint8_t *output1 = output;
  uint32_t max = n / 64U;
  uint8_t *out = output1;
  for (uint32_t i = 0U; i < max; i++)
  {
    EverCrypt_HMAC_compute_sha2_512(v, k, 64U, v, 64U);
    memcpy(out + i * 64U, v, 64U * sizeof (uint8_t));
  }
  if (max * 64U < n)
  {
    uint8_t *block = output1 + max * 64U;
    EverCrypt_HMAC_compute_sha2_512(v, k, 64U, v, 64U);
    memcpy(block, v, (n - max * 64U) * sizeof (uint8_t));
  }
  uint32_t input_len = 65U + additional_input_len;
  KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
  uint8_t input0[input_len];
  memset(input0, 0U, input_len * sizeof (uint8_t));
  uint8_t *k_ = input0;
  memcpy(k_, v, 64U * sizeof (uint8_t));
  if (additional_input_len != 0U)
  {
    memcpy(input0 + 65U, additional_input, additional_input_len * sizeof (uint8_t));
  }
  input0[64U] = 0U;
  EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
  EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
  memcpy(k, k_, 64U * sizeof (uint8_t));
  if (additional_input_len != 0U)
  {
    uint32_t input_len0 = 65U + additional_input_len;
    KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
    uint8_t input[input_len0];
    memset(input, 0U, input_len0 * sizeof (uint8_t));
    uint8_t *k_0 = input;
    memcpy(k_0, v, 64U * sizeof (uint8_t));
    if (additional_input_len != 0U)
    {
      memcpy(input + 65U, additional_input, additional_input_len * sizeof (uint8_t));
    }
    input[64U] = 1U;
    EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
    EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
    memcpy(k, k_0, 64U * sizeof (uint8_t));
  }
  uint32_t old_ctr = ctr[0U];
  ctr[0U] = old_ctr + 1U;
  return true;
}